

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O1

void __thiscall
embree::avx::BVHNSubdivPatch1MBlurBuilderSAH<4>::countSubPatches
          (BVHNSubdivPatch1MBlurBuilderSAH<4> *this,size_t *numSubPatches,size_t *numSubPatchesMB,
          ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pstate
          )

{
  undefined8 uVar1;
  Geometry *pGVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  runtime_error *this_00;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  BBox1f *pBVar16;
  undefined1 auVar17 [16];
  BBox1f BVar18;
  BBox1f BVar19;
  BBox1f BVar20;
  BBox1f BVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  Iterator<embree::SubdivMesh,_true> iter;
  size_t taskCount;
  task_group_context context;
  anon_class_1_0_00000001 local_1bb;
  undefined1 local_1ba [2];
  Iterator<embree::GridMesh,_false> local_1b8;
  BBox1f *local_1a8;
  unsigned_long local_1a0;
  anon_class_8_1_4d25ca37_conflict local_198;
  anon_class_8_1_898bcfc2_conflict10 local_190;
  anon_class_16_2_341d598e_conflict2 local_188;
  undefined1 local_178 [12];
  undefined2 uStack_16c;
  undefined2 uStack_16a;
  intrusive_list_node *local_158;
  intrusive_list_node *piStack_150;
  string_resource_index local_138;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  BBox1f local_98;
  BBox1f BStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  anon_class_48_6_afa08d2e_conflict2 local_60;
  
  local_1b8.scene = this->scene;
  local_1b8.all = false;
  sVar12 = ((local_1b8.scene)->geometries).size_active;
  if (sVar12 == 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    sVar8 = 0;
    do {
      pGVar2 = ((local_1b8.scene)->geometries).items[sVar8].ptr;
      if ((((pGVar2 == (Geometry *)0x0) || (((pGVar2->field_8).field_0x2 & 0x20) == 0)) ||
          (*(char *)&pGVar2->field_8 != '\x17')) || (pGVar2->numTimeSteps == 1)) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)pGVar2->numPrimitives;
      }
      uVar13 = uVar13 + uVar6;
      sVar8 = sVar8 + 1;
    } while (sVar12 != sVar8);
  }
  (pstate->super_ParallelForForState).N = uVar13;
  local_1a8 = (BBox1f *)numSubPatchesMB;
  iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar6 = uVar13 + 0x3ff >> 10;
  if ((ulong)(long)iVar4 < uVar6) {
    uVar6 = (long)iVar4;
  }
  uVar14 = 0x40;
  if (uVar6 < 0x40) {
    uVar14 = uVar6;
  }
  uVar14 = uVar14 + (uVar14 == 0);
  (pstate->super_ParallelForForState).taskCount = uVar14;
  (pstate->super_ParallelForForState).i0[0] = 0;
  (pstate->super_ParallelForForState).j0[0] = 0;
  if (1 < uVar6) {
    uVar10 = 0;
    uVar6 = uVar13 / uVar14;
    uVar11 = 1;
    sVar12 = 0;
    do {
      pGVar2 = ((local_1b8.scene)->geometries).items[sVar12].ptr;
      if ((((pGVar2 == (Geometry *)0x0) ||
           (((local_1b8.all & 1U) == 0 && (((pGVar2->field_8).field_0x2 & 0x20) == 0)))) ||
          (*(char *)&pGVar2->field_8 != '\x17')) || (pGVar2->numTimeSteps == 1)) {
        uVar14 = 0;
      }
      else {
        uVar14 = (ulong)pGVar2->numPrimitives;
      }
      if (uVar14 == 0) {
        lVar9 = 0;
      }
      else {
        uVar7 = (uVar11 + 1) * uVar13;
        lVar9 = 0;
        uVar15 = 0;
        do {
          uVar5 = uVar6;
          uVar6 = uVar5;
          if ((uVar10 + uVar14 + lVar9 < uVar5) ||
             ((pstate->super_ParallelForForState).taskCount <= uVar11)) break;
          (pstate->super_ParallelForForState).i0[uVar11] = sVar12;
          uVar15 = uVar15 + (uVar5 - uVar10);
          (pstate->super_ParallelForForState).j0[uVar11] = uVar15;
          uVar11 = uVar11 + 1;
          uVar6 = uVar7 / (pstate->super_ParallelForForState).taskCount;
          lVar9 = -uVar15;
          uVar7 = uVar7 + uVar13;
          uVar10 = uVar5;
        } while (uVar15 < uVar14);
      }
      uVar10 = uVar10 + uVar14 + lVar9;
      sVar12 = sVar12 + 1;
      uVar14 = (pstate->super_ParallelForForState).taskCount;
    } while (uVar11 < uVar14);
  }
  local_60.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_f8;
  local_f8 = INFINITY;
  fStack_f4 = INFINITY;
  fStack_f0 = INFINITY;
  fStack_ec = INFINITY;
  local_e8 = -INFINITY;
  fStack_e4 = -INFINITY;
  fStack_e0 = -INFINITY;
  fStack_dc = -INFINITY;
  local_d8 = INFINITY;
  fStack_d4 = INFINITY;
  fStack_d0 = INFINITY;
  fStack_cc = INFINITY;
  local_c8 = -INFINITY;
  fStack_c4 = -INFINITY;
  fStack_c0 = -INFINITY;
  fStack_bc = -INFINITY;
  local_b8 = INFINITY;
  fStack_b4 = INFINITY;
  fStack_b0 = INFINITY;
  fStack_ac = INFINITY;
  local_a8 = -INFINITY;
  fStack_a4 = -INFINITY;
  fStack_a0 = -INFINITY;
  fStack_9c = -INFINITY;
  local_98.lower = 0.0;
  local_98.upper = 0.0;
  BStack_90.lower = 0.0;
  BStack_90.upper = 0.0;
  uStack_88 = 0;
  uStack_80 = 0;
  local_78 = 0.0;
  auVar17._8_4_ = 0x3f800000;
  auVar17._0_8_ = &DAT_3f8000003f800000;
  auVar17._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar17);
  fStack_74 = (float)uVar1;
  fStack_70 = (float)((ulong)uVar1 >> 0x20);
  fStack_6c = 0.0;
  local_198.array2 = &local_1b8;
  local_60.getSize = &local_198;
  local_188.func = (anon_class_8_1_89912a77 *)local_1ba;
  local_60.func = &local_188;
  local_60.taskCount = &local_1a0;
  local_60.reduction = &local_1bb;
  uStack_16c = 0x401;
  local_158 = (intrusive_list_node *)0x0;
  piStack_150 = (intrusive_list_node *)0x0;
  local_138 = CUSTOM_CTX;
  local_1a0 = uVar14;
  local_188.array2 = (Iterator<embree::GridMesh,_true> *)local_198.array2;
  local_60.state = pstate;
  tbb::detail::r1::initialize((task_group_context *)local_178);
  local_190.func = &local_60;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar14,1,&local_190,(auto_partitioner *)(local_1ba + 1),
             (task_group_context *)local_178);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_178);
  if (cVar3 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy((task_group_context *)local_178);
  stack0xfffffffffffffe90 = (BBox1f)uStack_80;
  local_178._0_8_ = uStack_88;
  if (local_1a0 != 0) {
    BVar20.upper = fStack_74;
    BVar20.lower = local_78;
    BVar21.upper = fStack_6c;
    BVar21.lower = fStack_70;
    pBVar16 = &(pstate->prefix_state).sums[0].max_time_range;
    BVar18.lower = 0.0;
    BVar18.upper = 1.0;
    BVar19.lower = 1.0;
    BVar19.upper = 0.0;
    fVar25 = INFINITY;
    fVar22 = INFINITY;
    fVar23 = INFINITY;
    fVar24 = INFINITY;
    fVar29 = -INFINITY;
    fVar26 = -INFINITY;
    fVar27 = -INFINITY;
    fVar28 = -INFINITY;
    do {
      pBVar16[-0x10].lower = local_f8;
      pBVar16[-0x10].upper = fStack_f4;
      pBVar16[-0xf].lower = fStack_f0;
      pBVar16[-0xf].upper = fStack_ec;
      pBVar16[-0xe].lower = local_e8;
      pBVar16[-0xe].upper = fStack_e4;
      pBVar16[-0xd].lower = fStack_e0;
      pBVar16[-0xd].upper = fStack_dc;
      pBVar16[-0xc].lower = local_d8;
      pBVar16[-0xc].upper = fStack_d4;
      pBVar16[-0xb].lower = fStack_d0;
      pBVar16[-0xb].upper = fStack_cc;
      pBVar16[-10].lower = local_c8;
      pBVar16[-10].upper = fStack_c4;
      pBVar16[-9].lower = fStack_c0;
      pBVar16[-9].upper = fStack_bc;
      pBVar16[-8].lower = local_b8;
      pBVar16[-8].upper = fStack_b4;
      pBVar16[-7].lower = fStack_b0;
      pBVar16[-7].upper = fStack_ac;
      pBVar16[-6].lower = local_a8;
      pBVar16[-6].upper = fStack_a4;
      pBVar16[-5].lower = fStack_a0;
      pBVar16[-5].upper = fStack_9c;
      pBVar16[-4] = local_98;
      pBVar16[-3] = BStack_90;
      pBVar16[-2].lower = (float)local_178._0_4_;
      pBVar16[-2].upper = (float)local_178._4_4_;
      pBVar16[-1] = stack0xfffffffffffffe90;
      *pBVar16 = BVar20;
      pBVar16[1] = BVar21;
      local_98 = (BBox1f)((long)local_98 + (long)pBVar16[-0x484]);
      BStack_90 = (BBox1f)((long)BStack_90 + (long)pBVar16[-0x483]);
      pBVar16 = pBVar16 + 0x12;
      local_1a0 = local_1a0 - 1;
      local_b8 = fVar22;
      fStack_b4 = fVar23;
      fStack_b0 = fVar24;
      fStack_ac = fVar25;
      local_f8 = fVar22;
      fStack_f4 = fVar23;
      fStack_f0 = fVar24;
      fStack_ec = fVar25;
      local_d8 = fVar22;
      fStack_d4 = fVar23;
      fStack_d0 = fVar24;
      fStack_cc = fVar25;
      local_a8 = fVar26;
      fStack_a4 = fVar27;
      fStack_a0 = fVar28;
      fStack_9c = fVar29;
      local_e8 = fVar26;
      fStack_e4 = fVar27;
      fStack_e0 = fVar28;
      fStack_dc = fVar29;
      local_c8 = fVar26;
      fStack_c4 = fVar27;
      fStack_c0 = fVar28;
      fStack_bc = fVar29;
      BVar20 = BVar18;
      BVar21 = BVar19;
      _local_178 = ZEXT816(0) << 0x20;
    } while (local_1a0 != 0);
  }
  *numSubPatches = (size_t)local_98;
  *local_1a8 = BStack_90;
  return;
}

Assistant:

void countSubPatches(size_t& numSubPatches, size_t& numSubPatchesMB, ParallelForForPrefixSumState<PrimInfoMB>& pstate)
      {
        Scene::Iterator<SubdivMesh,true> iter(scene);
        pstate.init(iter,size_t(1024));

        PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB
        { 
          size_t s = 0;
          size_t sMB = 0;
          for (size_t f=r.begin(); f!=r.end(); ++f) 
          {          
            if (!mesh->valid(f)) continue;
            size_t count = patch_eval_subdivision_count(mesh->getHalfEdge(0,f));
            s += count;
            sMB += count * mesh->numTimeSteps;
          }
          return PrimInfoMB(s,sMB);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB(a.begin()+b.begin(),a.end()+b.end()); });

        numSubPatches = pinfo.begin();
        numSubPatchesMB = pinfo.end();
      }